

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlAttrPtr xmlSchemaGetPropNode(xmlNodePtr node,char *name)

{
  xmlAttrPtr pxVar1;
  int iVar2;
  
  if (name != (char *)0x0 && node != (xmlNodePtr)0x0) {
    for (pxVar1 = node->properties; pxVar1 != (xmlAttrPtr)0x0; pxVar1 = pxVar1->next) {
      if ((pxVar1->ns == (xmlNs *)0x0) &&
         (iVar2 = xmlStrEqual(pxVar1->name,(xmlChar *)name), iVar2 != 0)) {
        return pxVar1;
      }
    }
  }
  return (xmlAttrPtr)0x0;
}

Assistant:

static xmlAttrPtr
xmlSchemaGetPropNode(xmlNodePtr node, const char *name)
{
    xmlAttrPtr prop;

    if ((node == NULL) || (name == NULL))
	return(NULL);
    prop = node->properties;
    while (prop != NULL) {
        if ((prop->ns == NULL) && xmlStrEqual(prop->name, BAD_CAST name))
	    return(prop);
	prop = prop->next;
    }
    return (NULL);
}